

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsMakeSpanArrayMutable(void)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  pointer ptVar4;
  pointer pvVar5;
  reference piVar6;
  array<int,_4UL> *in_RDX;
  Util *in_RSI;
  undefined1 local_30 [8];
  Span<int,_4UL> span;
  array<int,_4UL> values;
  
  stack0xffffffffffffffe4 = 0x200000001;
  local_30 = (undefined1  [8])
             MILBlob::Util::MakeSpan<int,4ul>((Span<int,_4UL> *)&span.field_0xc,in_RSI,in_RDX);
  bVar1 = MILBlob::Util::Span<int,_4UL>::IsEmpty((Span<int,_4UL> *)local_30);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6e);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!span.IsEmpty()");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    values._M_elems[2] = 1;
  }
  else {
    sVar2 = MILBlob::Util::Span<int,_4UL>::Size((Span<int,_4UL> *)local_30);
    if (sVar2 == 4) {
      ptVar4 = MILBlob::Util::Span<int,_4UL>::Data((Span<int,_4UL> *)local_30);
      pvVar5 = std::array<int,_4UL>::data((array<int,_4UL> *)&span.field_0xc);
      if (ptVar4 == pvVar5) {
        piVar6 = MILBlob::Util::Span<int,_4UL>::Get<0UL,_0>((Span<int,_4UL> *)local_30);
        if (*piVar6 == 1) {
          values._M_elems[2] = 0;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x71);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,"(span.Get<0>()) == (1)");
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          values._M_elems[2] = 1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x70);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(span.Data()) == (values.data())");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        values._M_elems[2] = 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x6f);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(span.Size()) == (size_t(4))");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      values._M_elems[2] = 1;
    }
  }
  return values._M_elems[2];
}

Assistant:

int testSpanTestsMakeSpanArrayMutable()
{
    std::array<int, 4> values = {{1, 2, 3, 4}};
    auto span = MakeSpan(values);
    static_assert(std::is_same<decltype(span)::value_type, int>::value, "MakeSpan should make non-const T");

    ML_ASSERT(!span.IsEmpty());
    ML_ASSERT_EQ(span.Size(), size_t(4));
    ML_ASSERT_EQ(span.Data(), values.data());
    ML_ASSERT_EQ(span.Get<0>(), 1);

    return 0;
}